

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::
loadFromIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::RefIterator>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          RefIterator it)

{
  bool bVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffa8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffb0;
  RefIterator local_10;
  
  while( true ) {
    bVar1 = Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::RefIterator::
            hasNext(&local_10);
    if (!bVar1) break;
    Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::RefIterator::next
              (&local_10);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
              ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x927d62);
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }